

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O2

int __thiscall TPZStructMatrix::ClassId(TPZStructMatrix *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZStructMatrix",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZStrMatParInterface::ClassId
                    ((TPZStrMatParInterface *)(&this->field_0x0 + *(long *)(*(long *)this + -0x60)))
  ;
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZStructMatrix::ClassId() const{
    return Hash("TPZStructMatrix") ^
        TPZStrMatParInterface::ClassId() << 1;
}